

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O3

NodeDistancePairClass * __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::changeElement
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode,NodeDistancePairClass *newElement)

{
  uint uVar1;
  uint uVar2;
  NodeDistancePairClass *pNVar3;
  
  pNVar3 = (pNode->super_Node<ADS::NodeDistancePairClass_*>).el;
  (pNode->super_Node<ADS::NodeDistancePairClass_*>).el = newElement;
  uVar1 = (pNVar3->super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
  uVar2 = (newElement->super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
  if (uVar1 < uVar2) {
    if (this->_bIsMinHeap != true) {
LAB_00103ace:
      bubbleUp(this,pNode);
      return pNVar3;
    }
  }
  else {
    if (uVar1 <= uVar2) {
      return pNVar3;
    }
    if (this->_bIsMinHeap == true) goto LAB_00103ace;
  }
  bubbleDown(this,pNode);
  return pNVar3;
}

Assistant:

T BHeap<T, Comparator>::changeElement (BNode<T> *pNode, T newElement)
    {
        T oldElement = pNode->el;
        pNode->el = newElement;
        if (Comparator::greaterThan (newElement, oldElement))
            _bIsMinHeap ?  bubbleDown (pNode) : bubbleUp (pNode);
        else if (Comparator::lessThan (newElement, oldElement))
            _bIsMinHeap ? bubbleUp (pNode) : bubbleDown (pNode);

        return oldElement;
    }